

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

OneOf<kj::CompressionParameters,_kj::Exception> * __thiscall
kj::_::tryParseExtensionAgreement
          (OneOf<kj::CompressionParameters,_kj::Exception> *__return_storage_ptr__,_ *this,
          Maybe<kj::CompressionParameters> *clientOffer,StringPtr agreedParameters)

{
  RemoveConst<kj::ArrayPtr<const_char>_> *pRVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  undefined8 uVar5;
  ArrayPtr<const_char> *pAVar6;
  ArrayPtr<const_char> *pAVar7;
  byte extraout_DL;
  undefined1 uVar8;
  undefined8 configuration;
  undefined2 uVar9;
  NullableValue<kj::CompressionParameters> *__return_storage_ptr___00;
  char delim;
  String *__return_storage_ptr___01;
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  Vector<kj::ArrayPtr<const_char>_> offers;
  Exception e;
  NullableValue<kj::CompressionParameters> local_268;
  ArrayPtr<const_char> local_238;
  Vector<kj::ArrayPtr<const_char>_> local_228;
  Vector<kj::ArrayPtr<const_char>_> local_208;
  String local_1e8;
  ArrayPtr<const_char> local_1c8;
  Exception local_1b8;
  
  __return_storage_ptr___01 = &local_1e8;
  Debug::makeDescriptionInternal(__return_storage_ptr___01,"",(ArrayPtr<kj::String>)ZEXT816(0));
  pAVar6 = (ArrayPtr<const_char> *)0x148f;
  Exception::Exception
            (&local_1b8,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x148f,__return_storage_ptr___01);
  pAVar7 = (ArrayPtr<const_char> *)local_1e8.content.size_;
  pcVar2 = local_1e8.content.ptr;
  delim = (char)__return_storage_ptr___01;
  if (local_1e8.content.ptr != (char *)0x0) {
    local_1e8.content.ptr = (char *)0x0;
    local_1e8.content.size_ = 0;
    pAVar6 = pAVar7;
    (**(local_1e8.content.disposer)->_vptr_ArrayDisposer)
              (local_1e8.content.disposer,pcVar2,1,pAVar7,pAVar7,0);
    delim = (char)pAVar6;
    pAVar6 = pAVar7;
  }
  if (*this == (_)0x0) {
    local_208.builder.ptr = (ArrayPtr<const_char> *)0x50ffa7;
    local_208.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x23;
    local_228.builder.ptr = (ArrayPtr<const_char> *)0x4f68ab;
    local_228.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x3d;
    concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((String *)&local_268,(_ *)&local_208,(ArrayPtr<const_char> *)&local_228,pAVar6);
    sVar3 = local_1b8.description.content.size_;
    pcVar2 = local_1b8.description.content.ptr;
    if (local_1b8.description.content.ptr != (char *)0x0) {
      local_1b8.description.content.ptr = (char *)0x0;
      local_1b8.description.content.size_ = 0;
      (**(local_1b8.description.content.disposer)->_vptr_ArrayDisposer)
                (local_1b8.description.content.disposer,pcVar2,1,sVar3,sVar3,0);
    }
    local_1b8.description.content.disposer =
         (ArrayDisposer *)
         CONCAT71(local_268.field_1._9_7_,local_268.field_1.value.outboundMaxWindowBits.ptr.isSet);
    __return_storage_ptr__->tag = 2;
    *(char **)&__return_storage_ptr__->field_1 = local_1b8.ownFile.content.ptr;
    *(size_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_1b8.ownFile.content.size_;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x10) =
         local_1b8.ownFile.content.disposer;
    local_1b8.ownFile.content.ptr = (char *)0x0;
    local_1b8.ownFile.content.size_ = 0;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) = local_1b8.file;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_1b8._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_268._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_268.field_1._0_8_;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x38) =
         local_1b8.description.content.disposer;
    local_1b8.description.content.ptr = (char *)0x0;
    local_1b8.description.content.size_ = 0;
    *(Disposer **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_1b8.context.ptr.disposer;
    *(Context **)((long)&__return_storage_ptr__->field_1 + 0x48) = local_1b8.context.ptr.ptr;
    local_1b8.context.ptr.ptr = (Context *)0x0;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x50) = local_1b8.remoteTrace.content.ptr;
    *(size_t *)((long)&__return_storage_ptr__->field_1 + 0x58) = local_1b8.remoteTrace.content.size_
    ;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x60) =
         local_1b8.remoteTrace.content.disposer;
    local_1b8.remoteTrace.content.ptr = (char *)0x0;
    local_1b8.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&__return_storage_ptr__->field_1 + 0x68),local_1b8.trace,0x105);
    *(Detail **)((long)&__return_storage_ptr__->field_1 + 0x170) = local_1b8.details.builder.ptr;
    *(RemoveConst<kj::Exception::Detail> **)((long)&__return_storage_ptr__->field_1 + 0x178) =
         local_1b8.details.builder.pos;
    *(Detail **)((long)&__return_storage_ptr__->field_1 + 0x180) = local_1b8.details.builder.endPtr;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x188) =
         local_1b8.details.builder.disposer;
    local_1b8.details.builder.endPtr = (Detail *)0x0;
    local_1b8.details.builder.ptr = (Detail *)0x0;
    local_1b8.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    goto LAB_003a1b40;
  }
  input.size_ = 0x2c;
  input.ptr = agreedParameters.content.ptr + -1;
  splitParts(&local_208,(_ *)clientOffer,input,delim);
  if ((ArrayPtr<const_char> *)((long)local_208.builder.pos - (long)local_208.builder.ptr) ==
      (ArrayPtr<const_char> *)&DAT_00000010) {
    input_00.size_ = 0x3b;
    input_00.ptr = (char *)(local_208.builder.ptr)->size_;
    pAVar7 = (ArrayPtr<const_char> *)0x3b;
    splitParts(&local_228,(_ *)(local_208.builder.ptr)->ptr,input_00,delim);
    if (((local_228.builder.ptr)->size_ == 0x12) &&
       (iVar4 = bcmp((local_228.builder.ptr)->ptr,"permessage-deflate",0x12), iVar4 == 0)) {
      __return_storage_ptr___00 = &local_268;
      configuration = &local_228;
      uVar5 = tryExtractParameters
                        ((Maybe<kj::CompressionParameters> *)__return_storage_ptr___00,
                         (Vector<kj::ArrayPtr<const_char>_> *)configuration,true);
      uVar8 = extraout_DL;
      uVar9 = (ushort)__return_storage_ptr___00;
      if (local_268.isSet == true) {
        pAVar7 = (ArrayPtr<const_char> *)
                 CONCAT71((int7)((ulong)pAVar7 >> 8),
                          local_268.field_1.value.outboundMaxWindowBits.ptr.isSet);
        if (local_268.field_1.value.outboundMaxWindowBits.ptr.isSet == true) {
          local_268.field_1.value.outboundMaxWindowBits.ptr.isSet = false;
          uVar5 = local_268.field_1.value.outboundMaxWindowBits.ptr.field_1;
        }
        uVar8 = local_268.field_1.value.inboundMaxWindowBits.ptr.isSet;
        uVar9 = local_268.field_1._0_2_;
        if (local_268.field_1.value.inboundMaxWindowBits.ptr.isSet == true) {
          local_268.field_1.value.inboundMaxWindowBits.ptr.isSet = false;
          configuration = local_268.field_1.value.inboundMaxWindowBits.ptr.field_1;
        }
      }
      if (local_268.isSet == false) {
        local_238.ptr = "Server failed WebSocket handshake: ";
        local_238.size_ = 0x23;
        local_1c8.ptr =
             "the Sec-WebSocket-Extensions header in the Response included an invalid value.";
        local_1c8.size_ = 0x4e;
        concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  ((String *)&local_268,(_ *)&local_238,&local_1c8,pAVar7);
        sVar3 = local_1b8.description.content.size_;
        pcVar2 = local_1b8.description.content.ptr;
        if (local_1b8.description.content.ptr != (char *)0x0) {
          local_1b8.description.content.ptr = (char *)0x0;
          local_1b8.description.content.size_ = 0;
          (**(local_1b8.description.content.disposer)->_vptr_ArrayDisposer)
                    (local_1b8.description.content.disposer,pcVar2,1,sVar3,sVar3,0);
        }
        goto LAB_003a16d9;
      }
      if (*this == (_)0x0) {
        local_238.ptr = (char *)0x0;
        local_268.isSet = false;
        local_268._1_7_ = 0;
        local_268.field_1._0_8_ = 0;
        Debug::Fault::init((Fault *)&local_238,
                           (EVP_PKEY_CTX *)
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                          );
        Debug::Fault::fatal((Fault *)&local_238);
      }
      if (((ulong)pAVar7 & 1) == 0) {
        if (this[0x10] != (_)0x0) {
          uVar5 = *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this + 0x18);
          pAVar7 = (ArrayPtr<const_char> *)0x1;
        }
      }
      else if (this[0x10] != (_)0x0) {
        if (((ulong)pAVar7 & 1) == 0) {
          local_238.ptr = (char *)0x0;
          local_268.isSet = false;
          local_268._1_7_ = 0;
          local_268.field_1._0_8_ = 0;
          Debug::Fault::init((Fault *)&local_238,
                             (EVP_PKEY_CTX *)
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                            );
          Debug::Fault::fatal((Fault *)&local_238);
        }
        pAVar7 = (ArrayPtr<const_char> *)((ulong)pAVar7 & 0xff);
        if (((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this + 0x18))->value <
            (ulong)uVar5) {
          uVar5 = ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this + 0x18))->
                  value;
          pAVar7 = (ArrayPtr<const_char> *)0x1;
        }
      }
      if ((char)uVar9 == '\0') {
        uVar9 = uVar9 | (ushort)(byte)this[8];
      }
      __return_storage_ptr__->tag = 1;
      *(undefined2 *)&__return_storage_ptr__->field_1 = uVar9;
      (__return_storage_ptr__->field_1).space[8] = (byte)pAVar7;
      if (((ulong)pAVar7 & 1) != 0) {
        ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
        ((long)&__return_storage_ptr__->field_1 + 0x10))->value = uVar5;
      }
      (__return_storage_ptr__->field_1).space[0x18] = uVar8;
      if ((uVar8 & 1) != 0) {
        ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
        ((long)&__return_storage_ptr__->field_1 + 0x20))->value = configuration;
      }
    }
    else {
      local_238.ptr = "Server failed WebSocket handshake: ";
      local_238.size_ = 0x23;
      local_1c8.ptr =
           "response included a Sec-WebSocket-Extensions value that was not permessage-deflate.";
      local_1c8.size_ = 0x53;
      concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)&local_268,(_ *)&local_238,&local_1c8,pAVar7);
      sVar3 = local_1b8.description.content.size_;
      pcVar2 = local_1b8.description.content.ptr;
      if (local_1b8.description.content.ptr != (char *)0x0) {
        local_1b8.description.content.ptr = (char *)0x0;
        local_1b8.description.content.size_ = 0;
        (**(local_1b8.description.content.disposer)->_vptr_ArrayDisposer)
                  (local_1b8.description.content.disposer,pcVar2,1,sVar3,sVar3,0);
      }
LAB_003a16d9:
      local_1b8.description.content.disposer =
           (ArrayDisposer *)
           CONCAT71(local_268.field_1._9_7_,local_268.field_1.value.outboundMaxWindowBits.ptr.isSet)
      ;
      __return_storage_ptr__->tag = 2;
      *(char **)&__return_storage_ptr__->field_1 = local_1b8.ownFile.content.ptr;
      *(size_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_1b8.ownFile.content.size_;
      *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x10) =
           local_1b8.ownFile.content.disposer;
      local_1b8.ownFile.content.ptr = (char *)0x0;
      local_1b8.ownFile.content.size_ = 0;
      *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) = local_1b8.file;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_1b8._32_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_268._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_268.field_1._0_8_;
      *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x38) =
           local_1b8.description.content.disposer;
      local_1b8.description.content.ptr = (char *)0x0;
      local_1b8.description.content.size_ = 0;
      *(Disposer **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_1b8.context.ptr.disposer
      ;
      *(Context **)((long)&__return_storage_ptr__->field_1 + 0x48) = local_1b8.context.ptr.ptr;
      local_1b8.context.ptr.ptr = (Context *)0x0;
      *(char **)((long)&__return_storage_ptr__->field_1 + 0x50) = local_1b8.remoteTrace.content.ptr;
      *(size_t *)((long)&__return_storage_ptr__->field_1 + 0x58) =
           local_1b8.remoteTrace.content.size_;
      *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x60) =
           local_1b8.remoteTrace.content.disposer;
      local_1b8.remoteTrace.content.ptr = (char *)0x0;
      local_1b8.remoteTrace.content.size_ = 0;
      memcpy((void *)((long)&__return_storage_ptr__->field_1 + 0x68),local_1b8.trace,0x105);
      *(Detail **)((long)&__return_storage_ptr__->field_1 + 0x170) = local_1b8.details.builder.ptr;
      *(RemoveConst<kj::Exception::Detail> **)((long)&__return_storage_ptr__->field_1 + 0x178) =
           local_1b8.details.builder.pos;
      *(Detail **)((long)&__return_storage_ptr__->field_1 + 0x180) =
           local_1b8.details.builder.endPtr;
      *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x188) =
           local_1b8.details.builder.disposer;
      local_1b8.details.builder.endPtr = (Detail *)0x0;
      local_1b8.details.builder.ptr = (Detail *)0x0;
      local_1b8.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    }
    pAVar6 = local_228.builder.endPtr;
    pRVar1 = local_228.builder.pos;
    pAVar7 = local_228.builder.ptr;
    if (local_228.builder.ptr != (ArrayPtr<const_char> *)0x0) {
      local_228.builder.ptr = (ArrayPtr<const_char> *)0x0;
      local_228.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
      local_228.builder.endPtr = (ArrayPtr<const_char> *)0x0;
      (**(local_228.builder.disposer)->_vptr_ArrayDisposer)
                (local_228.builder.disposer,pAVar7,0x10,(long)pRVar1 - (long)pAVar7 >> 4,
                 (long)pAVar6 - (long)pAVar7 >> 4,0);
    }
  }
  else {
    local_228.builder.ptr = (ArrayPtr<const_char> *)0x50ffa7;
    local_228.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x23;
    local_238.ptr =
         "expected exactly one extension (permessage-deflate) but received more than one.";
    local_238.size_ = 0x4f;
    concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((String *)&local_268,(_ *)&local_228,&local_238,
               (ArrayPtr<const_char> *)((long)local_208.builder.pos - (long)local_208.builder.ptr));
    sVar3 = local_1b8.description.content.size_;
    pcVar2 = local_1b8.description.content.ptr;
    if (local_1b8.description.content.ptr != (char *)0x0) {
      local_1b8.description.content.ptr = (char *)0x0;
      local_1b8.description.content.size_ = 0;
      (**(local_1b8.description.content.disposer)->_vptr_ArrayDisposer)
                (local_1b8.description.content.disposer,pcVar2,1,sVar3,sVar3,0);
    }
    local_1b8.description.content.disposer =
         (ArrayDisposer *)
         CONCAT71(local_268.field_1._9_7_,local_268.field_1.value.outboundMaxWindowBits.ptr.isSet);
    __return_storage_ptr__->tag = 2;
    *(char **)&__return_storage_ptr__->field_1 = local_1b8.ownFile.content.ptr;
    *(size_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_1b8.ownFile.content.size_;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x10) =
         local_1b8.ownFile.content.disposer;
    local_1b8.ownFile.content.ptr = (char *)0x0;
    local_1b8.ownFile.content.size_ = 0;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) = local_1b8.file;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_1b8._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_268._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_268.field_1._0_8_;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x38) =
         local_1b8.description.content.disposer;
    local_1b8.description.content.ptr = (char *)0x0;
    local_1b8.description.content.size_ = 0;
    *(Disposer **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_1b8.context.ptr.disposer;
    *(Context **)((long)&__return_storage_ptr__->field_1 + 0x48) = local_1b8.context.ptr.ptr;
    local_1b8.context.ptr.ptr = (Context *)0x0;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x50) = local_1b8.remoteTrace.content.ptr;
    *(size_t *)((long)&__return_storage_ptr__->field_1 + 0x58) = local_1b8.remoteTrace.content.size_
    ;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x60) =
         local_1b8.remoteTrace.content.disposer;
    local_1b8.remoteTrace.content.ptr = (char *)0x0;
    local_1b8.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&__return_storage_ptr__->field_1 + 0x68),local_1b8.trace,0x105);
    *(Detail **)((long)&__return_storage_ptr__->field_1 + 0x170) = local_1b8.details.builder.ptr;
    *(RemoveConst<kj::Exception::Detail> **)((long)&__return_storage_ptr__->field_1 + 0x178) =
         local_1b8.details.builder.pos;
    *(Detail **)((long)&__return_storage_ptr__->field_1 + 0x180) = local_1b8.details.builder.endPtr;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x188) =
         local_1b8.details.builder.disposer;
    local_1b8.details.builder.endPtr = (Detail *)0x0;
    local_1b8.details.builder.ptr = (Detail *)0x0;
    local_1b8.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
  }
  pAVar6 = local_208.builder.endPtr;
  pRVar1 = local_208.builder.pos;
  pAVar7 = local_208.builder.ptr;
  if (local_208.builder.ptr != (ArrayPtr<const_char> *)0x0) {
    local_208.builder.ptr = (ArrayPtr<const_char> *)0x0;
    local_208.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
    local_208.builder.endPtr = (ArrayPtr<const_char> *)0x0;
    (**(local_208.builder.disposer)->_vptr_ArrayDisposer)
              (local_208.builder.disposer,pAVar7,0x10,(long)pRVar1 - (long)pAVar7 >> 4,
               (long)pAVar6 - (long)pAVar7 >> 4,0);
  }
LAB_003a1b40:
  Exception::~Exception(&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

kj::OneOf<CompressionParameters, kj::Exception> tryParseExtensionAgreement(
    const Maybe<CompressionParameters>& clientOffer,
    StringPtr agreedParameters) {
  // Like `tryParseExtensionOffers`, but called by the client when parsing the server's Response.
  // If the client must decline the agreement, we want to provide some details about what went wrong
  // (since the client has to fail the connection).
  constexpr auto FAILURE = "Server failed WebSocket handshake: "_kj;
  auto e = KJ_EXCEPTION(FAILED);

  if (clientOffer == kj::none) {
    // We've received extensions when we did not send any in the first place.
    e.setDescription(
        kj::str(FAILURE, "added Sec-WebSocket-Extensions when client did not offer any."));
    return kj::mv(e);
  }

  auto offers = splitParts(agreedParameters, ',');
  if (offers.size() != 1) {
    constexpr auto EXPECT = "expected exactly one extension (permessage-deflate) but received "
                            "more than one."_kj;
    e.setDescription(kj::str(FAILURE, EXPECT));
    return kj::mv(e);
  }
  auto splitOffer = splitParts(offers.front(), ';');

  if (splitOffer.front() != "permessage-deflate"_kj) {
    e.setDescription(kj::str(FAILURE, "response included a Sec-WebSocket-Extensions value that was "
                                      "not permessage-deflate."));
    return kj::mv(e);
  }

  // Verify the parameters of our single extension, and compare it with the clients original offer.
  KJ_IF_SOME(config, tryExtractParameters(splitOffer, true)) {
    const auto& client = KJ_ASSERT_NONNULL(clientOffer);
    // The server might have ignored the client's hints regarding its compressor's configuration.
    // That's fine, but as the client, we still want to use those outbound compression parameters.
    if (config.outboundMaxWindowBits == kj::none) {
      config.outboundMaxWindowBits = client.outboundMaxWindowBits;
    } else KJ_IF_SOME(value, client.outboundMaxWindowBits) {
      if (value < KJ_ASSERT_NONNULL(config.outboundMaxWindowBits)) {
        // If the client asked for a value smaller than what the server responded with, use the
        // value that the client originally specified.
        config.outboundMaxWindowBits = value;
      }
    }
    if (config.outboundNoContextTakeover == false) {
      config.outboundNoContextTakeover = client.outboundNoContextTakeover;
    }
    return kj::mv(config);
  }

  // There was a problem parsing the server's `Sec-WebSocket-Extensions` response.
  e.setDescription(kj::str(FAILURE, "the Sec-WebSocket-Extensions header in the Response included "
      "an invalid value."));
  return kj::mv(e);
}